

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

ON_Xform * operator*(ON_Xform *__return_storage_ptr__,double c,ON_Xform *xform)

{
  ON_Xform *cx;
  double x;
  double *p1;
  double *p;
  ON_Xform *xform_local;
  double c_local;
  
  memcpy(__return_storage_ptr__,xform,0x80);
  p1 = (double *)__return_storage_ptr__;
  while (p1 < __return_storage_ptr__ + 1) {
    *p1 = c * *p1;
    p1 = p1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Xform operator*(double c, const ON_Xform& xform)
{
  ON_Xform cx(xform);
  double* p = &cx.m_xform[0][0];
  double* p1 = p + 16;
  while (p < p1)
  {
    const double x = *p;
    *p++ = c*x;
  }
  return cx;
}